

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void sorter_sqrt_sort(int64_t *arr,size_t Len)

{
  uint uVar1;
  int64_t *extbuf;
  int *Tags;
  uint uVar2;
  
  uVar1 = 1;
  do {
    uVar2 = uVar1;
    uVar1 = uVar2 * 2;
  } while (uVar2 * uVar2 < Len);
  extbuf = (int64_t *)malloc((ulong)uVar2 * 8);
  if (extbuf != (int64_t *)0x0) {
    Tags = (int *)malloc((long)(((Len - 1) / (ulong)uVar2 << 0x20) + 0x200000000) >> 0x1e);
    if (Tags != (int *)0x0) {
      sorter_sqrt_sort_common_sort(arr,(int)Len,extbuf,Tags);
      free(Tags);
      free(extbuf);
      return;
    }
  }
  return;
}

Assistant:

void SQRT_SORT(SORT_TYPE *arr, size_t Len) {
  int L = 1;
  SORT_TYPE *ExtBuf;
  int *Tags;
  int NK;

  while (L * L < Len) {
    L *= 2;
  }

  NK = (int)((Len - 1) / L + 2);
  ExtBuf = SORT_NEW_BUFFER(L);

  if (ExtBuf == NULL) {
    return; /* fail */
  }

  Tags = (int *)malloc(NK * sizeof(int));

  if (Tags == NULL) {
    return;
  }

  SQRT_SORT_COMMON_SORT(arr, (int)Len, ExtBuf, Tags);
  free(Tags);
  SORT_DELETE_BUFFER(ExtBuf);
}